

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall cmComputeLinkInformation::LoadImplicitLinkInfo(cmComputeLinkInformation *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  char *pcVar4;
  string *psVar5;
  cmValue cVar6;
  pointer pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  _Alloc_node __an;
  string implicitLibVar;
  string implicitDirVar;
  cmList implicitDirs;
  cmList implicitLibs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  pointer local_e8;
  undefined8 local_e0;
  size_type local_d8;
  pointer local_d0;
  undefined8 local_c8;
  string local_c0;
  string local_a0;
  cmList local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  cmList local_48;
  
  pcVar2 = this->Makefile;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES","");
  psVar5 = (string *)cmMakefile::GetDefinition(pcVar2,&local_a0);
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  paVar1 = &local_108.field_2;
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + psVar5->_M_string_length);
  init._M_len = 1;
  init._M_array = &local_108;
  cmList::cmList(&local_68,init);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1));
  }
  pcVar2 = this->Makefile;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_LIBRARY_ARCHITECTURE","");
  cVar6 = cmMakefile::GetDefinition(pcVar2,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (cVar6.Value != (string *)0x0) {
    local_50 = local_68.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (local_68.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_68.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_108._M_string_length = (size_type)(pbVar7->_M_dataplus)._M_p;
        local_108._M_dataplus._M_p = (pointer)pbVar7->_M_string_length;
        local_108.field_2._M_allocated_capacity = 0;
        local_a0._M_dataplus._M_p = (pointer)0x0;
        local_a0._M_string_length = 1;
        local_e8 = (pointer)((long)&local_a0.field_2 + 8);
        local_a0.field_2._M_local_buf[8] = '/';
        local_108.field_2._8_8_ = 1;
        local_e0 = 0;
        local_d0 = ((cVar6.Value)->_M_dataplus)._M_p;
        local_d8 = (cVar6.Value)->_M_string_length;
        local_c8 = 0;
        views._M_len = 3;
        views._M_array = (iterator)&local_108;
        local_a0.field_2._M_allocated_capacity = (size_type)local_e8;
        cmCatViews(&local_c0,views);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->ImplicitLinkDirs,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_50);
    }
  }
  local_108._M_dataplus._M_p = (pointer)0x6;
  local_108._M_string_length = 0x83b123;
  local_108.field_2._M_allocated_capacity = 0;
  local_e8 = (this->LinkLanguage)._M_dataplus._M_p;
  local_108.field_2._8_8_ = (this->LinkLanguage)._M_string_length;
  local_e0 = 0;
  local_d8 = 0x1a;
  local_d0 = "_IMPLICIT_LINK_DIRECTORIES";
  local_c8 = 0;
  views_00._M_len = 3;
  views_00._M_array = (iterator)&local_108;
  cmCatViews(&local_a0,views_00);
  cVar6 = cmMakefile::GetDefinition(this->Makefile,&local_a0);
  if (cVar6.Value != (string *)0x0) {
    cmList::Insert(&local_68.Values,
                   (const_iterator)
                   local_68.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,cVar6.Value,Yes,No);
  }
  if (local_68.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_68.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_108._M_dataplus._M_p = (pointer)&this->ImplicitLinkDirs;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::
      _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ImplicitLinkDirs,
                 (const_iterator)&(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header,pbVar7
                 ,(_Alloc_node *)&local_108);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_68.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_108._M_dataplus._M_p = (pointer)0x6;
  local_108._M_string_length = 0x83b123;
  local_108.field_2._M_allocated_capacity = 0;
  local_e8 = (this->LinkLanguage)._M_dataplus._M_p;
  local_108.field_2._8_8_ = (this->LinkLanguage)._M_string_length;
  local_e0 = 0;
  local_d8 = 0x18;
  local_d0 = "_IMPLICIT_LINK_LIBRARIES";
  local_c8 = 0;
  views_01._M_len = 3;
  views_01._M_array = (iterator)&local_108;
  cmCatViews(&local_c0,views_01);
  psVar5 = (string *)cmMakefile::GetDefinition(this->Makefile,&local_c0);
  paVar1 = &local_108.field_2;
  if (psVar5 == (string *)0x0) {
    psVar5 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + psVar5->_M_string_length);
  init_00._M_len = 1;
  init_00._M_array = &local_108;
  cmList::cmList(&local_48,init_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (local_48.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar7 = local_48.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar4 = (pbVar7->_M_dataplus)._M_p;
      if ((*pcVar4 != '-') || (pcVar4[1] == 'l')) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->ImplicitLinkLibs,pbVar7);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_48.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar2 = this->Makefile;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"CMAKE_PLATFORM_RUNTIME_PATH","");
  cVar6 = cmMakefile::GetDefinition(pcVar2,&local_108);
  if (cVar6.Value != (string *)0x0) {
    cmList::Insert(&this->RuntimeLinkDirs,
                   (this->RuntimeLinkDirs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,cVar6.Value,Yes,No);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48.Values);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.Values);
  return;
}

Assistant:

void cmComputeLinkInformation::LoadImplicitLinkInfo()
{
  // Get platform-wide implicit directories.
  cmList implicitDirs{ this->Makefile->GetDefinition(
    "CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES") };

  // Append library architecture to all implicit platform directories
  // and add them to the set
  if (cmValue libraryArch =
        this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE")) {
    for (auto const& i : implicitDirs) {
      this->ImplicitLinkDirs.insert(cmStrCat(i, '/', *libraryArch));
    }
  }

  // Get language-specific implicit directories.
  std::string implicitDirVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_DIRECTORIES");
  implicitDirs.append(this->Makefile->GetDefinition(implicitDirVar));

  // Store implicit link directories.
  this->ImplicitLinkDirs.insert(implicitDirs.begin(), implicitDirs.end());

  // Get language-specific implicit libraries.
  std::string implicitLibVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_LIBRARIES");
  cmList implicitLibs{ this->Makefile->GetDefinition(implicitLibVar) };

  // Store implicit link libraries.
  for (auto const& item : implicitLibs) {
    // Items starting in '-' but not '-l' are flags, not libraries,
    // and should not be filtered by this implicit list.
    if (item[0] != '-' || item[1] == 'l') {
      this->ImplicitLinkLibs.insert(item);
    }
  }

  // Get platform specific rpath link directories
  cmList::append(this->RuntimeLinkDirs,
                 this->Makefile->GetDefinition("CMAKE_PLATFORM_RUNTIME_PATH"));
}